

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O0

StatusOr<google::protobuf::FeatureSetDefaults> * __thiscall
google::protobuf::FeatureResolver::CompileDefaults
          (StatusOr<google::protobuf::FeatureSetDefaults> *__return_storage_ptr__,
          FeatureResolver *this,Descriptor *feature_set,
          Span<const_google::protobuf::FieldDescriptor_*const> extensions,Edition minimum_edition,
          Edition maximum_edition)

{
  size_type *this_00;
  Edition EVar1;
  FieldDescriptor *extension_00;
  bool bVar2;
  int iVar3;
  iterator ppFVar4;
  Descriptor *pDVar5;
  LogMessage *pLVar6;
  reference pEVar7;
  pointer pDVar8;
  undefined4 extraout_var;
  Message *pMVar9;
  undefined4 extraout_var_00;
  type overridable;
  pointer pMVar10;
  Reflection *pRVar11;
  RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *this_01;
  FeatureSet *pFVar12;
  MessageLite *pMVar13;
  iterator iVar14;
  string_view sVar15;
  string local_2b0;
  string_view local_290;
  string local_280;
  string_view local_260;
  FeatureSetDefaults_FeatureSetEditionDefault *local_250;
  FeatureSetDefaults_FeatureSetEditionDefault *edition_defaults;
  Status _status_4;
  FieldDescriptor *extension_2;
  iterator __end3;
  iterator __begin3;
  Span<const_google::protobuf::FieldDescriptor_*const> *__range3;
  Status _status_3;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
  overridable_defaults_dynamic;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
  fixed_defaults_dynamic;
  Edition *edition;
  undefined1 local_1f0 [8];
  iterator __end2_2;
  undefined1 local_1d0 [8];
  iterator __begin2_2;
  btree_set<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>_>
  *__range2_2;
  __single_object message_factory;
  FeatureSetDefaults defaults;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
  local_168;
  Status local_158;
  btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
  *local_150;
  int local_148;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
  local_140;
  btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
  *local_130;
  int local_128;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
  local_120;
  Status local_110;
  btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
  *local_108;
  int local_100;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
  local_f8;
  byte local_e1;
  LogMessage local_e0;
  Voidify local_c9;
  FieldDescriptor *local_c8;
  FieldDescriptor *extension_1;
  iterator __end2_1;
  iterator __begin2_1;
  Span<const_google::protobuf::FieldDescriptor_*const> *__range2_1;
  btree_set<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>_>
  editions;
  Status _status_2;
  Status _status_1;
  FieldDescriptor *extension;
  iterator __end2;
  iterator __begin2;
  Span<const_google::protobuf::FieldDescriptor_*const> *__range2;
  Status local_58;
  Status _status;
  Status local_38;
  Edition local_30;
  Edition local_2c;
  Edition maximum_edition_local;
  Edition minimum_edition_local;
  Descriptor *feature_set_local;
  Span<const_google::protobuf::FieldDescriptor_*const> extensions_local;
  
  extensions_local.ptr_ = extensions.ptr_;
  local_2c = (Edition)extensions.len_;
  local_30 = minimum_edition;
  _maximum_edition_local = (Descriptor *)this;
  feature_set_local = feature_set;
  extensions_local.len_ = (size_type)__return_storage_ptr__;
  if ((int)minimum_edition < (int)local_2c) {
    protobuf::(anonymous_namespace)::
    Error<char_const*,google::protobuf::Edition,char_const*,google::protobuf::Edition>
              ((_anonymous_namespace_ *)&local_38,"Invalid edition range, edition ",local_2c,
               " is newer than edition ",minimum_edition);
    absl::lts_20250127::StatusOr<google::protobuf::FeatureSetDefaults>::
    StatusOr<absl::lts_20250127::Status,_0>(__return_storage_ptr__,&local_38);
    absl::lts_20250127::Status::~Status(&local_38);
  }
  else if (this == (FeatureResolver *)0x0) {
    protobuf::(anonymous_namespace)::Error<char_const*>
              ((_anonymous_namespace_ *)&_status,
               "Unable to find definition of google.protobuf.FeatureSet in descriptor pool.");
    absl::lts_20250127::StatusOr<google::protobuf::FeatureSetDefaults>::
    StatusOr<absl::lts_20250127::Status,_0>(__return_storage_ptr__,&_status);
    absl::lts_20250127::Status::~Status(&_status);
  }
  else {
    anon_unknown_21::ValidateDescriptor((anon_unknown_21 *)&local_58,(Descriptor *)this);
    bVar2 = absl::lts_20250127::Status::ok(&local_58);
    bVar2 = ((bVar2 ^ 0xffU) & 1) != 0;
    if (bVar2) {
      absl::lts_20250127::StatusOr<google::protobuf::FeatureSetDefaults>::
      StatusOr<const_absl::lts_20250127::Status,_0>(__return_storage_ptr__,&local_58);
    }
    absl::lts_20250127::Status::~Status(&local_58);
    if (!bVar2) {
      __end2 = absl::lts_20250127::Span<const_google::protobuf::FieldDescriptor_*const>::begin
                         ((Span<const_google::protobuf::FieldDescriptor_*const> *)&feature_set_local
                         );
      ppFVar4 = absl::lts_20250127::Span<const_google::protobuf::FieldDescriptor_*const>::end
                          ((Span<const_google::protobuf::FieldDescriptor_*const> *)
                           &feature_set_local);
      for (; __end2 != ppFVar4; __end2 = __end2 + 1) {
        extension_00 = *__end2;
        anon_unknown_21::ValidateExtension
                  ((anon_unknown_21 *)&_status_2,_maximum_edition_local,extension_00);
        bVar2 = absl::lts_20250127::Status::ok(&_status_2);
        bVar2 = ((bVar2 ^ 0xffU) & 1) != 0;
        if (bVar2) {
          absl::lts_20250127::StatusOr<google::protobuf::FeatureSetDefaults>::
          StatusOr<const_absl::lts_20250127::Status,_0>(__return_storage_ptr__,&_status_2);
        }
        absl::lts_20250127::Status::~Status(&_status_2);
        if (bVar2) {
          return __return_storage_ptr__;
        }
        pDVar5 = FieldDescriptor::message_type(extension_00);
        this_00 = &editions.
                   super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
                   .
                   super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
                   .tree_.size_;
        anon_unknown_21::ValidateDescriptor((anon_unknown_21 *)this_00,pDVar5);
        bVar2 = absl::lts_20250127::Status::ok((Status *)this_00);
        bVar2 = ((bVar2 ^ 0xffU) & 1) != 0;
        if (bVar2) {
          absl::lts_20250127::StatusOr<google::protobuf::FeatureSetDefaults>::
          StatusOr<const_absl::lts_20250127::Status,_0>
                    (__return_storage_ptr__,
                     (Status *)
                     &editions.
                      super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
                      .
                      super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
                      .tree_.size_);
        }
        absl::lts_20250127::Status::~Status
                  ((Status *)
                   &editions.
                    super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
                    .
                    super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
                    .tree_.size_);
        if (bVar2) {
          return __return_storage_ptr__;
        }
      }
      absl::lts_20250127::
      btree_set<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>_>
      ::btree_set((btree_set<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>_>
                   *)&__range2_1);
      anon_unknown_21::CollectEditions
                (_maximum_edition_local,local_30,
                 (btree_set<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>_>
                  *)&__range2_1);
      __begin2_1 = (iterator)&feature_set_local;
      __end2_1 = absl::lts_20250127::Span<const_google::protobuf::FieldDescriptor_*const>::begin
                           ((Span<const_google::protobuf::FieldDescriptor_*const> *)__begin2_1);
      extension_1 = (FieldDescriptor *)
                    absl::lts_20250127::Span<const_google::protobuf::FieldDescriptor_*const>::end
                              ((Span<const_google::protobuf::FieldDescriptor_*const> *)__begin2_1);
      for (; (FieldDescriptor *)__end2_1 != extension_1; __end2_1 = __end2_1 + 1) {
        local_c8 = *__end2_1;
        pDVar5 = FieldDescriptor::message_type(local_c8);
        anon_unknown_21::CollectEditions
                  (pDVar5,local_30,
                   (btree_set<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>_>
                    *)&__range2_1);
      }
      local_e1 = 0;
      bVar2 = absl::lts_20250127::container_internal::
              btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
              ::empty((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
                       *)&__range2_1);
      if (bVar2) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_e0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/feature_resolver.cc"
                   ,0x1c4,"!editions.empty()");
        local_e1 = 1;
        pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_e0);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_c9,pLVar6);
      }
      if ((local_e1 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_e0);
      }
      iVar14 = absl::lts_20250127::container_internal::
               btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
               ::begin((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
                        *)&__range2_1);
      local_108 = iVar14.node_;
      local_100 = iVar14.position_;
      local_f8.node_ =
           (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
            *)local_108;
      local_f8.position_ = local_100;
      pEVar7 = absl::lts_20250127::container_internal::
               btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
               ::operator*(&local_f8);
      if (*pEVar7 == EDITION_LEGACY) {
        iVar14 = absl::lts_20250127::container_internal::
                 btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
                 ::begin((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
                          *)&__range2_1);
        local_150 = iVar14.node_;
        local_148 = iVar14.position_;
        local_140.node_ =
             (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
              *)local_150;
        local_140.position_ = local_148;
        pEVar7 = absl::lts_20250127::container_internal::
                 btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                 ::operator*(&local_140);
        EVar1 = local_2c;
        if ((int)local_2c < (int)*pEVar7) {
          iVar14 = absl::lts_20250127::container_internal::
                   btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
                   ::begin((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
                            *)&__range2_1);
          local_168.node_ =
               (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
                *)iVar14.node_;
          local_168.position_ = iVar14.position_;
          pEVar7 = absl::lts_20250127::container_internal::
                   btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                   ::operator*(&local_168);
          protobuf::(anonymous_namespace)::
          Error<char_const*,google::protobuf::Edition,char_const*,google::protobuf::Edition>
                    ((_anonymous_namespace_ *)&local_158,"Minimum edition ",EVar1,
                     " is earlier than the oldest valid edition ",*pEVar7);
          absl::lts_20250127::StatusOr<google::protobuf::FeatureSetDefaults>::
          StatusOr<absl::lts_20250127::Status,_0>(__return_storage_ptr__,&local_158);
          absl::lts_20250127::Status::~Status(&local_158);
        }
        else {
          FeatureSetDefaults::FeatureSetDefaults((FeatureSetDefaults *)&message_factory);
          FeatureSetDefaults::set_minimum_edition((FeatureSetDefaults *)&message_factory,local_2c);
          FeatureSetDefaults::set_maximum_edition((FeatureSetDefaults *)&message_factory,local_30);
          std::make_unique<google::protobuf::DynamicMessageFactory>();
          __begin2_2._8_8_ = &__range2_1;
          iVar14 = absl::lts_20250127::container_internal::
                   btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
                   ::begin((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
                            *)__begin2_2._8_8_);
          __end2_2._8_8_ = iVar14.node_;
          __begin2_2.node_._0_4_ = iVar14.position_;
          local_1d0 = (undefined1  [8])__end2_2._8_8_;
          iVar14 = absl::lts_20250127::container_internal::
                   btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
                   ::end((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
                          *)__begin2_2._8_8_);
          local_1f0 = (undefined1  [8])iVar14.node_;
          __end2_2.node_._0_4_ = iVar14.position_;
          while( true ) {
            bVar2 = absl::lts_20250127::container_internal::
                    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                    ::operator!=((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                                  *)local_1d0,(iterator *)local_1f0);
            if (!bVar2) break;
            pEVar7 = absl::lts_20250127::container_internal::
                     btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                     ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                                  *)local_1d0);
            pDVar8 = std::
                     unique_ptr<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                     ::operator->((unique_ptr<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                                   *)&__range2_2);
            iVar3 = (*(pDVar8->super_MessageFactory)._vptr_MessageFactory[2])
                              (pDVar8,_maximum_edition_local);
            pMVar9 = Message::New((Message *)CONCAT44(extraout_var,iVar3));
            absl::lts_20250127::WrapUnique<google::protobuf::Message>
                      ((lts_20250127 *)&overridable_defaults_dynamic,pMVar9);
            pDVar8 = std::
                     unique_ptr<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                     ::operator->((unique_ptr<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                                   *)&__range2_2);
            iVar3 = (*(pDVar8->super_MessageFactory)._vptr_MessageFactory[2])
                              (pDVar8,_maximum_edition_local);
            pMVar9 = Message::New((Message *)CONCAT44(extraout_var_00,iVar3));
            absl::lts_20250127::WrapUnique<google::protobuf::Message>
                      ((lts_20250127 *)&_status_3,pMVar9);
            EVar1 = *pEVar7;
            overridable = std::
                          unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                          ::operator*(&overridable_defaults_dynamic);
            std::
            unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
            operator*((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                       *)&_status_3);
            anon_unknown_21::FillDefaults((Edition)&__range3,(Message *)(ulong)EVar1,overridable);
            bVar2 = absl::lts_20250127::Status::ok((Status *)&__range3);
            bVar2 = ((bVar2 ^ 0xffU) & 1) != 0;
            if (bVar2) {
              absl::lts_20250127::StatusOr<google::protobuf::FeatureSetDefaults>::
              StatusOr<const_absl::lts_20250127::Status,_0>
                        (__return_storage_ptr__,(Status *)&__range3);
            }
            absl::lts_20250127::Status::~Status((Status *)&__range3);
            if (!bVar2) {
              __end3 = absl::lts_20250127::Span<const_google::protobuf::FieldDescriptor_*const>::
                       begin((Span<const_google::protobuf::FieldDescriptor_*const> *)
                             &feature_set_local);
              ppFVar4 = absl::lts_20250127::Span<const_google::protobuf::FieldDescriptor_*const>::
                        end((Span<const_google::protobuf::FieldDescriptor_*const> *)
                            &feature_set_local);
              for (; __end3 != ppFVar4; __end3 = __end3 + 1) {
                _status_4.rep_ = (uintptr_t)*__end3;
                EVar1 = *pEVar7;
                pMVar10 = std::
                          unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                          ::operator->(&overridable_defaults_dynamic);
                pRVar11 = Message::GetReflection(pMVar10);
                pMVar10 = std::
                          unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                          ::get(&overridable_defaults_dynamic);
                pMVar9 = Reflection::MutableMessage
                                   (pRVar11,pMVar10,(FieldDescriptor *)_status_4.rep_,
                                    (MessageFactory *)0x0);
                pMVar10 = std::
                          unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                          ::operator->((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                                        *)&_status_3);
                pRVar11 = Message::GetReflection(pMVar10);
                pMVar10 = std::
                          unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                          ::get((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                                 *)&_status_3);
                Reflection::MutableMessage
                          (pRVar11,pMVar10,(FieldDescriptor *)_status_4.rep_,(MessageFactory *)0x0);
                anon_unknown_21::FillDefaults
                          ((Edition)&edition_defaults,(Message *)(ulong)EVar1,pMVar9);
                bVar2 = absl::lts_20250127::Status::ok((Status *)&edition_defaults);
                bVar2 = ((bVar2 ^ 0xffU) & 1) != 0;
                if (bVar2) {
                  absl::lts_20250127::StatusOr<google::protobuf::FeatureSetDefaults>::
                  StatusOr<const_absl::lts_20250127::Status,_0>
                            (__return_storage_ptr__,(Status *)&edition_defaults);
                }
                absl::lts_20250127::Status::~Status((Status *)&edition_defaults);
                if (bVar2) goto LAB_0044b1f8;
              }
              this_01 = FeatureSetDefaults::mutable_defaults((FeatureSetDefaults *)&message_factory)
              ;
              local_250 = RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>
                          ::Add(this_01);
              FeatureSetDefaults_FeatureSetEditionDefault::set_edition(local_250,*pEVar7);
              pFVar12 = FeatureSetDefaults_FeatureSetEditionDefault::mutable_fixed_features
                                  (local_250);
              pMVar13 = &std::
                         unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                         ::operator->(&overridable_defaults_dynamic)->super_MessageLite;
              MessageLite::SerializeAsString_abi_cxx11_(&local_280,pMVar13);
              sVar15 = (string_view)
                       std::__cxx11::string::operator_cast_to_basic_string_view
                                 ((string *)&local_280);
              local_260 = sVar15;
              MessageLite::MergeFromString((MessageLite *)pFVar12,sVar15);
              std::__cxx11::string::~string((string *)&local_280);
              pFVar12 = FeatureSetDefaults_FeatureSetEditionDefault::mutable_overridable_features
                                  (local_250);
              pMVar13 = &std::
                         unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                         ::operator->((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                                       *)&_status_3)->super_MessageLite;
              MessageLite::SerializeAsString_abi_cxx11_(&local_2b0,pMVar13);
              sVar15 = (string_view)
                       std::__cxx11::string::operator_cast_to_basic_string_view
                                 ((string *)&local_2b0);
              local_290 = sVar15;
              MessageLite::MergeFromString((MessageLite *)pFVar12,sVar15);
              std::__cxx11::string::~string((string *)&local_2b0);
              bVar2 = false;
            }
LAB_0044b1f8:
            std::
            unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
            ~unique_ptr((unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                         *)&_status_3);
            std::
            unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
            ~unique_ptr(&overridable_defaults_dynamic);
            if (bVar2) goto LAB_0044b296;
            absl::lts_20250127::container_internal::
            btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
            ::operator++((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                          *)local_1d0);
          }
          absl::lts_20250127::StatusOr<google::protobuf::FeatureSetDefaults>::
          StatusOr<google::protobuf::FeatureSetDefaults,_0>
                    (__return_storage_ptr__,(FeatureSetDefaults *)&message_factory);
LAB_0044b296:
          std::
          unique_ptr<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
          ::~unique_ptr((unique_ptr<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                         *)&__range2_2);
          FeatureSetDefaults::~FeatureSetDefaults((FeatureSetDefaults *)&message_factory);
        }
      }
      else {
        iVar14 = absl::lts_20250127::container_internal::
                 btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
                 ::begin((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>_>
                          *)&__range2_1);
        local_130 = iVar14.node_;
        local_128 = iVar14.position_;
        local_120.node_ =
             (btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>
              *)local_130;
        local_120.position_ = local_128;
        pEVar7 = absl::lts_20250127::container_internal::
                 btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>,_256,_false>_>,_const_google::protobuf::Edition_&,_const_google::protobuf::Edition_*>
                 ::operator*(&local_120);
        protobuf::(anonymous_namespace)::Error<char_const*,google::protobuf::Edition,char_const*>
                  ((_anonymous_namespace_ *)&local_110,"Minimum edition ",*pEVar7,
                   " is not EDITION_LEGACY");
        absl::lts_20250127::StatusOr<google::protobuf::FeatureSetDefaults>::
        StatusOr<absl::lts_20250127::Status,_0>(__return_storage_ptr__,&local_110);
        absl::lts_20250127::Status::~Status(&local_110);
      }
      absl::lts_20250127::
      btree_set<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>_>
      ::~btree_set((btree_set<google::protobuf::Edition,_std::less<google::protobuf::Edition>,_std::allocator<google::protobuf::Edition>_>
                    *)&__range2_1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

absl::StatusOr<FeatureSetDefaults> FeatureResolver::CompileDefaults(
    const Descriptor* feature_set,
    absl::Span<const FieldDescriptor* const> extensions,
    Edition minimum_edition, Edition maximum_edition) {
  if (minimum_edition > maximum_edition) {
    return Error("Invalid edition range, edition ", minimum_edition,
                 " is newer than edition ", maximum_edition);
  }
  // Find and validate the FeatureSet in the pool.
  if (feature_set == nullptr) {
    return Error(
        "Unable to find definition of google.protobuf.FeatureSet in descriptor pool.");
  }
  RETURN_IF_ERROR(ValidateDescriptor(*feature_set));

  // Collect and validate all the FeatureSet extensions.
  for (const auto* extension : extensions) {
    RETURN_IF_ERROR(ValidateExtension(*feature_set, extension));
    RETURN_IF_ERROR(ValidateDescriptor(*extension->message_type()));
  }

  // Collect all the editions with unique defaults.
  absl::btree_set<Edition> editions;
  CollectEditions(*feature_set, maximum_edition, editions);
  for (const auto* extension : extensions) {
    CollectEditions(*extension->message_type(), maximum_edition, editions);
  }
  // Sanity check validation conditions above.
  ABSL_CHECK(!editions.empty());
  if (*editions.begin() != EDITION_LEGACY) {
    return Error("Minimum edition ", *editions.begin(),
                 " is not EDITION_LEGACY");
  }

  if (*editions.begin() > minimum_edition) {
    return Error("Minimum edition ", minimum_edition,
                 " is earlier than the oldest valid edition ",
                 *editions.begin());
  }

  // Fill the default spec.
  FeatureSetDefaults defaults;
  defaults.set_minimum_edition(minimum_edition);
  defaults.set_maximum_edition(maximum_edition);
  auto message_factory = absl::make_unique<DynamicMessageFactory>();
  for (const auto& edition : editions) {
    auto fixed_defaults_dynamic =
        absl::WrapUnique(message_factory->GetPrototype(feature_set)->New());
    auto overridable_defaults_dynamic =
        absl::WrapUnique(message_factory->GetPrototype(feature_set)->New());
    RETURN_IF_ERROR(FillDefaults(edition, *fixed_defaults_dynamic,
                                 *overridable_defaults_dynamic));
    for (const auto* extension : extensions) {
      RETURN_IF_ERROR(FillDefaults(
          edition,
          *fixed_defaults_dynamic->GetReflection()->MutableMessage(
              fixed_defaults_dynamic.get(), extension),
          *overridable_defaults_dynamic->GetReflection()->MutableMessage(
              overridable_defaults_dynamic.get(), extension)));
    }
    auto* edition_defaults = defaults.mutable_defaults()->Add();
    edition_defaults->set_edition(edition);
    edition_defaults->mutable_fixed_features()->MergeFromString(
        fixed_defaults_dynamic->SerializeAsString());
    edition_defaults->mutable_overridable_features()->MergeFromString(
        overridable_defaults_dynamic->SerializeAsString());
  }
  return defaults;
}